

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf32.c
# Opt level: O0

void elf32_writestabstr(FILE *f)

{
  StrTabList *in_RDI;
  FILE *unaff_retaddr;
  StabCompUnit *cu;
  node *local_10;
  
  if (stabdebugidx != 0) {
    for (local_10 = stabcompunits.first; local_10->next != (node *)0x0; local_10 = local_10->next) {
      elf_writestrtab(unaff_retaddr,in_RDI);
    }
  }
  return;
}

Assistant:

static void elf32_writestabstr(FILE *f)
{
  if (stabdebugidx) {
    struct StabCompUnit *cu;

    for (cu=(struct StabCompUnit *)stabcompunits.first;
         cu->n.next!=NULL; cu=(struct StabCompUnit *)cu->n.next)
      elf_writestrtab(f,&cu->strtab);
  }
}